

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void OPN2_DoRegWrite(ym3438_t *chip)

{
  ushort uVar1;
  byte bVar2;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  Bit8u BVar15;
  uint uVar16;
  uint uVar17;
  byte bVar18;
  uint uVar19;
  byte bVar20;
  Bit8u BVar21;
  bool bVar22;
  ushort uVar23;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  BVar15 = chip->write_fm_data;
  if (BVar15 != '\0') {
    uVar17 = chip->channel;
    uVar19 = chip->cycles % 0xc;
    uVar1 = chip->address;
    if (op_offset[uVar19] == (uVar1 & 0x107)) {
      uVar16 = uVar19 + 0xc;
      if ((uVar1 & 8) == 0) {
        uVar16 = uVar19;
      }
      switch((uVar1 & 0xf0) - 0x30 >> 4) {
      case 0:
        bVar18 = chip->data;
        bVar20 = bVar18 & 0xf;
        BVar21 = '\x01';
        if (bVar20 != 0) {
          BVar21 = bVar20 * '\x02';
        }
        chip->multi[uVar16] = BVar21;
        chip->dt[uVar16] = bVar18 >> 4 & 7;
        break;
      case 1:
        chip->tl[uVar16] = chip->data & 0x7f;
        break;
      case 2:
        bVar18 = chip->data;
        chip->ar[uVar16] = bVar18 & 0x1f;
        chip->ks[uVar16] = bVar18 >> 6;
        break;
      case 3:
        bVar18 = chip->data;
        chip->dr[uVar16] = bVar18 & 0x1f;
        chip->am[uVar16] = bVar18 >> 7;
        break;
      case 4:
        chip->sr[uVar16] = chip->data & 0x1f;
        break;
      case 5:
        bVar18 = chip->data;
        chip->rr[uVar16] = bVar18 & 0xf;
        bVar18 = bVar18 >> 4;
        chip->sl[uVar16] = bVar18 + 1 & 0x10 | bVar18;
        break;
      case 6:
        chip->ssg_eg[uVar16] = chip->data & 0xf;
      }
    }
    if (ch_offset[uVar17] == (uVar1 & 0x103)) {
      switch((uVar1 & 0xfc) - 0xa0 >> 2) {
      case 0:
        bVar18 = chip->reg_a4;
        chip->fnum[uVar17] = (bVar18 & 7) << 8 | (ushort)chip->data;
        bVar18 = bVar18 >> 3 & 7;
        chip->block[uVar17] = bVar18;
        chip->kcode[uVar17] = bVar18 << 2 | (byte)fn_note[chip->fnum[uVar17] >> 7];
        break;
      case 1:
        chip->reg_a4 = chip->data;
        break;
      case 2:
        bVar18 = chip->reg_ac;
        chip->fnum_3ch[uVar17] = (bVar18 & 7) << 8 | (ushort)chip->data;
        bVar18 = bVar18 >> 3 & 7;
        chip->block_3ch[uVar17] = bVar18;
        chip->kcode_3ch[uVar17] = bVar18 << 2 | (byte)fn_note[chip->fnum_3ch[uVar17] >> 7];
        break;
      case 3:
        chip->reg_ac = chip->data;
        break;
      case 4:
        bVar18 = chip->data;
        chip->connect[uVar17] = bVar18 & 7;
        chip->fb[uVar17] = bVar18 >> 3 & 7;
        break;
      case 5:
        bVar18 = chip->data;
        chip->pms[uVar17] = bVar18 & 7;
        chip->ams[uVar17] = bVar18 >> 4 & 3;
        chip->pan_l[uVar17] = bVar18 >> 7;
        chip->pan_r[uVar17] = bVar18 >> 6 & 1;
      }
    }
  }
  BVar21 = chip->write_a_en;
  if (BVar21 == '\0') {
    if (chip->write_d_en == '\0') goto LAB_001704e8;
  }
  else {
    chip->write_fm_data = '\0';
    BVar15 = '\0';
  }
  if ((chip->write_fm_address != '\0') && (chip->write_d_en != '\0')) {
    chip->write_fm_data = '\x01';
    BVar15 = '\x01';
  }
  if (BVar21 != '\0') {
    bVar22 = (chip->write_data & 0xf0) != 0;
    if (bVar22) {
      chip->address = chip->write_data;
    }
    chip->write_fm_address = bVar22;
  }
  if (((chip->write_d_en != '\0') && (uVar1 = chip->write_data, (uVar1 >> 8 & 1) == 0)) &&
     (chip->write_fm_mode_a - 0x21 < 0xc)) {
    bVar18 = (byte)uVar1;
    switch((uint)chip->write_fm_mode_a) {
    case 0x21:
      uVar12 = uVar1 >> 4 & 0xff;
      uVar13 = uVar1 >> 5 & 0xff;
      uVar14 = uVar1 >> 6 & 0xff;
      uVar23 = uVar1 >> 7 & 0xff;
      uVar8 = uVar1 & 0xff;
      uVar9 = uVar1 >> 1 & 0xff;
      uVar10 = uVar1 >> 2 & 0xff;
      uVar11 = uVar1 >> 3 & 0xff;
      bVar18 = (uVar8 != 0) * (uVar8 < 0x100) * bVar18 - (0xff < uVar8);
      bVar20 = (uVar9 != 0) * (uVar9 < 0x100) * (char)(uVar1 >> 1) - (0xff < uVar9);
      bVar7 = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar1 >> 2) - (0xff < uVar10);
      bVar2 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar1 >> 3) - (0xff < uVar11);
      bVar3 = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar1 >> 4) - (0xff < uVar12);
      bVar4 = (uVar13 != 0) * (uVar13 < 0x100) * (char)(uVar1 >> 5) - (0xff < uVar13);
      bVar5 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar1 >> 6) - (0xff < uVar14);
      bVar6 = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar1 >> 7) - (0xff < uVar23);
      *(ulong *)chip->mode_test_21 =
           CONCAT17((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                    CONCAT16((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                             CONCAT15((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                      CONCAT14((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                               (0xff < bVar3),
                                               CONCAT13((bVar2 != 0) * (bVar2 < 0x100) * bVar2 -
                                                        (0xff < bVar2),
                                                        CONCAT12((bVar7 != 0) * (bVar7 < 0x100) *
                                                                 bVar7 - (0xff < bVar7),
                                                                 CONCAT11((bVar20 != 0) *
                                                                          (bVar20 < 0x100) * bVar20
                                                                          - (0xff < bVar20),
                                                                          (bVar18 != 0) *
                                                                          (bVar18 < 0x100) * bVar18
                                                                          - (0xff < bVar18)))))))) &
           (ulong)DAT_001ed1e0;
      break;
    case 0x22:
      bVar20 = 0x7f;
      if ((uVar1 & 8) == 0) {
        bVar20 = bVar18 & 8;
      }
      chip->lfo_en = bVar20;
      chip->lfo_freq = bVar18 & 7;
      break;
    case 0x24:
      chip->timer_a_reg = (chip->timer_a_reg & 3) + (uVar1 & 0xff) * 4;
      break;
    case 0x25:
      chip->timer_a_reg = uVar1 & 3 | chip->timer_a_reg & 0x3fc;
      break;
    case 0x26:
      chip->timer_b_reg = uVar1 & 0xff;
      break;
    case 0x27:
      chip->mode_ch3 = bVar18 >> 6;
      chip->mode_csm = bVar18 >> 6 == 2;
      chip->timer_a_load = bVar18 & 1;
      chip->timer_a_enable = bVar18 >> 2 & 1;
      chip->timer_a_reset = bVar18 >> 4 & 1;
      chip->timer_b_load = bVar18 >> 1 & 1;
      chip->timer_b_enable = bVar18 >> 3 & 1;
      chip->timer_b_reset = bVar18 >> 5 & 1;
      break;
    case 0x28:
      uVar8 = uVar1 >> 4 & 0xff;
      uVar9 = uVar1 >> 5 & 0xff;
      uVar10 = uVar1 >> 6 & 0xff;
      uVar11 = uVar1 >> 7 & 0xff;
      bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar1 >> 4) - (0xff < uVar8);
      bVar7 = (uVar9 != 0) * (uVar9 < 0x100) * (char)(uVar1 >> 5) - (0xff < uVar9);
      bVar20 = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar1 >> 6) - (0xff < uVar10);
      bVar18 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar1 >> 7) - (0xff < uVar11);
      *(uint *)chip->mode_kon_operator =
           CONCAT13((bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18),
                    CONCAT12((bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20),
                             CONCAT11((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                      (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)))) &
           (uint)DAT_001ed1f0;
      uVar17 = uVar1 & 3;
      if (uVar17 == 3) {
        chip->mode_kon_channel = 0xff;
      }
      else {
        chip->mode_kon_channel = ((byte)((int)((uint)uVar1 << 0x1d) >> 0x1f) & 3) + (char)uVar17;
      }
      break;
    case 0x2a:
      chip->dacdata = (chip->dacdata & 1U) + uVar1 * 2 ^ 0x100;
      break;
    case 0x2b:
      chip->dacen = (Bit8u)(uVar1 >> 7);
      break;
    case 0x2c:
      uVar11 = uVar1 >> 4 & 0xff;
      uVar12 = uVar1 >> 5 & 0xff;
      uVar13 = uVar1 >> 6 & 0xff;
      uVar14 = uVar1 >> 7 & 0xff;
      uVar23 = uVar1 & 0xff;
      uVar8 = uVar1 >> 1 & 0xff;
      uVar9 = uVar1 >> 2 & 0xff;
      uVar10 = uVar1 >> 3 & 0xff;
      bVar2 = (uVar23 != 0) * (uVar23 < 0x100) * bVar18 - (0xff < uVar23);
      bVar3 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar1 >> 1) - (0xff < uVar8);
      bVar4 = (uVar9 != 0) * (uVar9 < 0x100) * (char)(uVar1 >> 2) - (0xff < uVar9);
      bVar5 = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar1 >> 3) - (0xff < uVar10);
      bVar6 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar1 >> 4) - (0xff < uVar11);
      bVar7 = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar1 >> 5) - (0xff < uVar12);
      bVar20 = (uVar13 != 0) * (uVar13 < 0x100) * (char)(uVar1 >> 6) - (0xff < uVar13);
      bVar18 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar1 >> 7) - (0xff < uVar14);
      *(ulong *)chip->mode_test_2c =
           CONCAT17((bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18),
                    CONCAT16((bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20),
                             CONCAT15((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                      CONCAT14((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                               (0xff < bVar6),
                                               CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                        (0xff < bVar5),
                                                        CONCAT12((bVar4 != 0) * (bVar4 < 0x100) *
                                                                 bVar4 - (0xff < bVar4),
                                                                 CONCAT11((bVar3 != 0) *
                                                                          (bVar3 < 0x100) * bVar3 -
                                                                          (0xff < bVar3),
                                                                          (bVar2 != 0) *
                                                                          (bVar2 < 0x100) * bVar2 -
                                                                          (0xff < bVar2)))))))) &
           (ulong)DAT_001ed1e0;
      chip->dacdata = (ushort)chip->mode_test_2c[3] | chip->dacdata & 0x1feU;
      if (chip->mode_test_2c[7] == '\0') {
        bVar22 = chip->mode_test_2c[6] != '\0';
      }
      else {
        bVar22 = false;
      }
      chip->eg_custom_timer = bVar22;
    }
  }
  if (BVar21 != '\0') {
    chip->write_fm_mode_a = chip->write_data & 0x1ff;
  }
LAB_001704e8:
  if (BVar15 != '\0') {
    chip->data = (Bit8u)chip->write_data;
  }
  return;
}

Assistant:

void OPN2_DoRegWrite(ym3438_t *chip)
{
    Bit32u i;
    Bit32u slot = chip->cycles % 12;
    Bit32u address;
    Bit32u channel = chip->channel;
    /* Update registers */
    if (chip->write_fm_data)
    {
        /* Slot */
        if (op_offset[slot] == (chip->address & 0x107))
        {
            if (chip->address & 0x08)
            {
                /* OP2, OP4 */
                slot += 12;
            }
            address = chip->address & 0xf0;
            switch (address)
            {
            case 0x30: /* DT, MULTI */
                chip->multi[slot] = chip->data & 0x0f;
                if (!chip->multi[slot])
                {
                    chip->multi[slot] = 1;
                }
                else
                {
                    chip->multi[slot] <<= 1;
                }
                chip->dt[slot] = (chip->data >> 4) & 0x07;
                break;
            case 0x40: /* TL */
                chip->tl[slot] = chip->data & 0x7f;
                break;
            case 0x50: /* KS, AR */
                chip->ar[slot] = chip->data & 0x1f;
                chip->ks[slot] = (chip->data >> 6) & 0x03;
                break;
            case 0x60: /* AM, DR */
                chip->dr[slot] = chip->data & 0x1f;
                chip->am[slot] = (chip->data >> 7) & 0x01;
                break;
            case 0x70: /* SR */
                chip->sr[slot] = chip->data & 0x1f;
                break;
            case 0x80: /* SL, RR */
                chip->rr[slot] = chip->data & 0x0f;
                chip->sl[slot] = (chip->data >> 4) & 0x0f;
                chip->sl[slot] |= (chip->sl[slot] + 1) & 0x10;
                break;
            case 0x90: /* SSG-EG */
                chip->ssg_eg[slot] = chip->data & 0x0f;
                break;
            default:
                break;
            }
        }

        /* Channel */
        if (ch_offset[channel] == (chip->address & 0x103))
        {
            address = chip->address & 0xfc;
            switch (address)
            {
            case 0xa0:
                chip->fnum[channel] = (chip->data & 0xff) | ((chip->reg_a4 & 0x07) << 8);
                chip->block[channel] = (chip->reg_a4 >> 3) & 0x07;
                chip->kcode[channel] = (chip->block[channel] << 2) | fn_note[chip->fnum[channel] >> 7];
                break;
            case 0xa4:
                chip->reg_a4 = chip->data & 0xff;
                break;
            case 0xa8:
                chip->fnum_3ch[channel] = (chip->data & 0xff) | ((chip->reg_ac & 0x07) << 8);
                chip->block_3ch[channel] = (chip->reg_ac >> 3) & 0x07;
                chip->kcode_3ch[channel] = (chip->block_3ch[channel] << 2) | fn_note[chip->fnum_3ch[channel] >> 7];
                break;
            case 0xac:
                chip->reg_ac = chip->data & 0xff;
                break;
            case 0xb0:
                chip->connect[channel] = chip->data & 0x07;
                chip->fb[channel] = (chip->data >> 3) & 0x07;
                break;
            case 0xb4:
                chip->pms[channel] = chip->data & 0x07;
                chip->ams[channel] = (chip->data >> 4) & 0x03;
                chip->pan_l[channel] = (chip->data >> 7) & 0x01;
                chip->pan_r[channel] = (chip->data >> 6) & 0x01;
                break;
            default:
                break;
            }
        }
    }

    if (chip->write_a_en || chip->write_d_en)
    {
        /* Data */
        if (chip->write_a_en)
        {
            chip->write_fm_data = 0;
        }

        if (chip->write_fm_address && chip->write_d_en)
        {
            chip->write_fm_data = 1;
        }

        /* Address */
        if (chip->write_a_en)
        {
            if ((chip->write_data & 0xf0) != 0x00)
            {
                /* FM Write */
                chip->address = chip->write_data;
                chip->write_fm_address = 1;
            }
            else
            {
                /* SSG write */
                chip->write_fm_address = 0;
            }
        }

        /* FM Mode */
        /* Data */
        if (chip->write_d_en && (chip->write_data & 0x100) == 0)
        {
            switch (chip->write_fm_mode_a)
            {
            case 0x21: /* LSI test 1 */
                for (i = 0; i < 8; i++)
                {
                    chip->mode_test_21[i] = (chip->write_data >> i) & 0x01;
                }
                break;
            case 0x22: /* LFO control */
                if ((chip->write_data >> 3) & 0x01)
                {
                    chip->lfo_en = 0x7f;
                }
                else
                {
                    chip->lfo_en = 0;
                }
                chip->lfo_freq = chip->write_data & 0x07;
                break;
            case 0x24: /* Timer A */
                chip->timer_a_reg &= 0x03;
                chip->timer_a_reg |= (chip->write_data & 0xff) << 2;
                break;
            case 0x25:
                chip->timer_a_reg &= 0x3fc;
                chip->timer_a_reg |= chip->write_data & 0x03;
                break;
            case 0x26: /* Timer B */
                chip->timer_b_reg = chip->write_data & 0xff;
                break;
            case 0x27: /* CSM, Timer control */
                chip->mode_ch3 = (chip->write_data & 0xc0) >> 6;
                chip->mode_csm = chip->mode_ch3 == 2;
                chip->timer_a_load = chip->write_data & 0x01;
                chip->timer_a_enable = (chip->write_data >> 2) & 0x01;
                chip->timer_a_reset = (chip->write_data >> 4) & 0x01;
                chip->timer_b_load = (chip->write_data >> 1) & 0x01;
                chip->timer_b_enable = (chip->write_data >> 3) & 0x01;
                chip->timer_b_reset = (chip->write_data >> 5) & 0x01;
                break;
            case 0x28: /* Key on/off */
                for (i = 0; i < 4; i++)
                {
                    chip->mode_kon_operator[i] = (chip->write_data >> (4 + i)) & 0x01;
                }
                if ((chip->write_data & 0x03) == 0x03)
                {
                    /* Invalid address */
                    chip->mode_kon_channel = 0xff;
                }
                else
                {
                    chip->mode_kon_channel = (chip->write_data & 0x03) + ((chip->write_data >> 2) & 1) * 3;
                }
                break;
            case 0x2a: /* DAC data */
                chip->dacdata &= 0x01;
                chip->dacdata |= (chip->write_data ^ 0x80) << 1;
                break;
            case 0x2b: /* DAC enable */
                chip->dacen = chip->write_data >> 7;
                break;
            case 0x2c: /* LSI test 2 */
                for (i = 0; i < 8; i++)
                {
                    chip->mode_test_2c[i] = (chip->write_data >> i) & 0x01;
                }
                chip->dacdata &= 0x1fe;
                chip->dacdata |= chip->mode_test_2c[3];
                chip->eg_custom_timer = !chip->mode_test_2c[7] && chip->mode_test_2c[6];
                break;
            default:
                break;
            }
        }

        /* Address */
        if (chip->write_a_en)
        {
            chip->write_fm_mode_a = chip->write_data & 0x1ff;
        }
    }

    if (chip->write_fm_data)
    {
        chip->data = chip->write_data & 0xff;
    }
}